

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_AddPegoutTxOut_Test::TestBody
          (ConfidentialTransactionContext_AddPegoutTxOut_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  char *expected_predicate_value;
  AssertionResult gtest_ar_2;
  Address pegout_addr;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address addr;
  ConfidentialTransactionContext txc;
  Privkey *success;
  Address *in_stack_fffffffffffff3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  undefined4 in_stack_fffffffffffff3d0;
  undefined4 uVar4;
  uint in_stack_fffffffffffff3d4;
  ByteData *lhs_expression;
  undefined4 in_stack_fffffffffffff3e4;
  AssertHelper local_b58;
  Message local_b50;
  string local_b48 [32];
  string local_b28 [32];
  AssertionResult local_b08;
  undefined1 local_af8 [376];
  string local_980;
  AssertHelper local_960;
  Message local_958;
  byte local_949;
  AssertionResult local_948;
  string local_938;
  AssertHelper local_918;
  Message local_910;
  byte local_901;
  AssertionResult local_900;
  AssertHelper local_8f0;
  Message local_8e8;
  string local_8e0 [32];
  AssertionResult local_8c0;
  AssertHelper local_8b0;
  Message local_8a8;
  string local_8a0 [32];
  AssertionResult local_880;
  allocator local_869;
  string local_868 [32];
  ConfidentialAssetId local_848;
  _func_int **local_820;
  undefined1 local_818;
  undefined1 local_810 [24];
  string local_7f8 [32];
  ByteData local_7d8;
  allocator local_7b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  allocator local_791;
  string local_790 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  allocator local_749;
  string local_748 [32];
  undefined1 local_728 [32];
  string local_708 [32];
  Address local_6e8 [383];
  allocator local_569;
  string local_568 [32];
  BlockHash local_548;
  allocator local_521;
  string local_520 [32];
  ConfidentialAssetId local_500;
  _func_int **local_4d8;
  undefined1 local_4d0;
  undefined1 local_4c8 [24];
  string local_4b0 [32];
  ConfidentialAssetId local_490;
  _func_int **local_468;
  undefined1 local_460;
  undefined1 local_458 [47];
  allocator local_429;
  string local_428 [32];
  Address local_408 [383];
  allocator local_289;
  string local_288 [32];
  Txid local_268;
  Address local_238 [376];
  Txid local_c0 [6];
  
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_c0,2,0);
  cfd::core::Address::Address(local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_288,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",&local_289
            );
  cfd::core::Txid::Txid(&local_268,local_288);
  cfd::core::ConfidentialTransaction::AddTxIn(local_c0,(uint)&local_268,0,(Script *)0xfffffffd);
  cfd::core::Txid::~Txid((Txid *)0x1d9d2e);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA",&local_429);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(local_408,local_428,(vector *)(local_458 + 0x10));
  local_468 = (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_460 = extraout_DL;
  local_458._0_8_ = local_468;
  local_458[8] = extraout_DL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4b0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)(local_4c8 + 0x17));
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_490,local_4b0);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)local_c0,(Amount *)local_408,(ConfidentialAssetId *)local_458);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1d9e83);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)(local_4c8 + 0x17));
  cfd::core::Address::~Address(in_stack_fffffffffffff3c0);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0));
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  local_4d8 = (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_4d0 = extraout_DL_00;
  local_4c8._0_8_ = local_4d8;
  local_4c8[8] = extraout_DL_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_520,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",&local_521
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_500,local_520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_568,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206",&local_569
            );
  cfd::core::BlockHash::BlockHash(&local_548,local_568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_708,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",(allocator *)(local_728 + 0x1f));
  cfd::core::Address::Address(local_6e8,local_708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_748,"0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d",
             &local_749);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_728,local_748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_790,"cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL",&local_791);
  cfd::core::Privkey::FromWif((string *)&local_770,(NetType)local_790,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7b8,
             "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))"
             ,&local_7b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7f8,
             "030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"
             ,(allocator *)(local_810 + 0x17));
  cfd::core::ByteData::ByteData(&local_7d8,local_7f8);
  lhs_expression = &local_7d8;
  lhs = &local_7b8;
  rhs = &local_770;
  success = (Privkey *)local_728;
  uVar4 = 0;
  expected_predicate_value = (char *)0x2;
  cfd::ConfidentialTransactionContext::AddPegoutTxOut
            ((Amount *)local_c0,(ConfidentialAssetId *)local_4c8,(BlockHash *)&local_500,
             (Address *)&local_548,(NetType)local_6e8,(Pubkey *)0x2,success,(string *)rhs,(uint)lhs,
             (ByteData *)((ulong)in_stack_fffffffffffff3d4 << 0x20),(NetType)lhs_expression,
             (Address *)CONCAT44(in_stack_fffffffffffff3e4,4));
  cfd::core::ByteData::~ByteData((ByteData *)0x1da1af);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)(local_810 + 0x17));
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
  cfd::core::Privkey::~Privkey((Privkey *)0x1da1f0);
  std::__cxx11::string::~string(local_790);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x1da217);
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  cfd::core::Address::~Address((Address *)rhs);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator((allocator<char> *)(local_728 + 0x1f));
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x1da265);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1da28c);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  local_820 = (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_818 = extraout_DL_01;
  local_810._0_8_ = local_820;
  local_810[8] = extraout_DL_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_868,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",&local_869
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_848,local_868);
  cfd::core::ConfidentialTransaction::AddTxOutFee
            ((Amount *)local_c0,(ConfidentialAssetId *)local_810);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1da361);
  std::__cxx11::string::~string(local_868);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_880,"txc.GetHex().c_str()",
             "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
             ,pcVar3,
             "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
            );
  std::__cxx11::string::~string(local_8a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_880);
  if (!bVar1) {
    testing::Message::Message(&local_8a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1da8b7);
    testing::internal::AssertHelper::AssertHelper
              (&local_8b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x141,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8b0,&local_8a8);
    testing::internal::AssertHelper::~AssertHelper(&local_8b0);
    testing::Message::~Message((Message *)0x1da914);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1da96c);
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_8c0,"addr.GetAddress().c_str()",
             "\"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo\"",pcVar3,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo")
  ;
  std::__cxx11::string::~string(local_8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8c0);
  if (!bVar1) {
    testing::Message::Message(&local_8e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1daa53);
    testing::internal::AssertHelper::AssertHelper
              (&local_8f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x142,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8f0,&local_8e8);
    testing::internal::AssertHelper::~AssertHelper(&local_8f0);
    testing::Message::~Message((Message *)0x1daab0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dab05);
  bVar2 = cfd::ConfidentialTransactionContext::HasPegoutTxOut((uint)local_c0);
  local_901 = ~bVar2 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)rhs,(bool *)success,(type *)0x1dab42);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_900);
  if (!bVar1) {
    testing::Message::Message(&local_910);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_938,(internal *)&local_900,(AssertionResult *)"txc.HasPegoutTxOut(0)","true",
               "false",expected_predicate_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_918,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x144,pcVar3);
    testing::internal::AssertHelper::operator=(&local_918,&local_910);
    testing::internal::AssertHelper::~AssertHelper(&local_918);
    std::__cxx11::string::~string((string *)&local_938);
    testing::Message::~Message((Message *)0x1dac3a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dacb2);
  local_949 = cfd::ConfidentialTransactionContext::HasPegoutTxOut((uint)local_c0);
  local_949 = local_949 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)rhs,(bool *)success,(type *)0x1dacf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_948);
  if (!bVar1) {
    testing::Message::Message(&local_958);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_980,(internal *)&local_948,(AssertionResult *)"txc.HasPegoutTxOut(1)","false",
               "true",expected_predicate_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_960,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x145,pcVar3);
    testing::internal::AssertHelper::operator=(&local_960,&local_958);
    testing::internal::AssertHelper::~AssertHelper(&local_960);
    std::__cxx11::string::~string((string *)&local_980);
    testing::Message::~Message((Message *)0x1dade8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dae63);
  cfd::ConfidentialTransactionContext::GetTxOutPegoutAddress((uint)local_af8,(NetType)local_c0);
  cfd::core::Address::GetAddress_abi_cxx11_();
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)lhs_expression,(char *)CONCAT44(in_stack_fffffffffffff3d4,uVar4),lhs,rhs);
  std::__cxx11::string::~string(local_b48);
  std::__cxx11::string::~string(local_b28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b08);
  if (!bVar1) {
    testing::Message::Message(&local_b50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1dafc7);
    testing::internal::AssertHelper::AssertHelper
              (&local_b58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x147,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b58,&local_b50);
    testing::internal::AssertHelper::~AssertHelper(&local_b58);
    testing::Message::~Message((Message *)0x1db024);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1db079);
  cfd::core::Address::~Address((Address *)rhs);
  cfd::core::Address::~Address((Address *)rhs);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)rhs);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddPegoutTxOut)
{
    ConfidentialTransactionContext txc(2, 0);
    Address addr;
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"),
        NetType::kRegtest,
        Pubkey("0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        Privkey::FromWif("cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL", NetType::kRegtest),
        "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))",
        0,
        ByteData("030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        NetType::kElementsRegtest,
        &addr);
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");
    EXPECT_STREQ(addr.GetAddress().c_str(), "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");

    EXPECT_FALSE(txc.HasPegoutTxOut(0));
    EXPECT_TRUE(txc.HasPegoutTxOut(1));
    auto pegout_addr = txc.GetTxOutPegoutAddress(1, NetType::kRegtest);
    EXPECT_EQ(pegout_addr.GetAddress(), addr.GetAddress());
}